

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Program.cpp
# Opt level: O2

int llvm::sys::ExecuteAndWait
              (StringRef Program,ArrayRef<llvm::StringRef> Args,
              Optional<llvm::ArrayRef<llvm::StringRef>_> Env,
              ArrayRef<llvm::Optional<llvm::StringRef>_> Redirects,uint SecondsToWait,
              uint MemoryLimit,string *ErrMsg,bool *ExecutionFailed)

{
  bool bVar1;
  int iVar2;
  ProcessInfo PVar3;
  ProcessInfo PI;
  
  if ((Redirects.Length != 0) && (Redirects.Length != 3)) {
    __assert_fail("Redirects.empty() || Redirects.size() == 3",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/Program.cpp"
                  ,0x24,
                  "int llvm::sys::ExecuteAndWait(StringRef, ArrayRef<StringRef>, Optional<ArrayRef<StringRef>>, ArrayRef<Optional<StringRef>>, unsigned int, unsigned int, std::string *, bool *)"
                 );
  }
  ProcessInfo::ProcessInfo(&PI);
  bVar1 = Execute(&PI,Program,Args,Env,Redirects,MemoryLimit,ErrMsg);
  if (bVar1) {
    if (ExecutionFailed != (bool *)0x0) {
      *ExecutionFailed = false;
    }
    PVar3 = Wait(&PI,SecondsToWait,SecondsToWait == 0,ErrMsg);
    iVar2 = PVar3.ReturnCode;
  }
  else {
    iVar2 = -1;
    if (ExecutionFailed != (bool *)0x0) {
      *ExecutionFailed = true;
    }
  }
  return iVar2;
}

Assistant:

int sys::ExecuteAndWait(StringRef Program, ArrayRef<StringRef> Args,
                        Optional<ArrayRef<StringRef>> Env,
                        ArrayRef<Optional<StringRef>> Redirects,
                        unsigned SecondsToWait, unsigned MemoryLimit,
                        std::string *ErrMsg, bool *ExecutionFailed) {
  assert(Redirects.empty() || Redirects.size() == 3);
  ProcessInfo PI;
  if (Execute(PI, Program, Args, Env, Redirects, MemoryLimit, ErrMsg)) {
    if (ExecutionFailed)
      *ExecutionFailed = false;
    ProcessInfo Result = Wait(
        PI, SecondsToWait, /*WaitUntilTerminates=*/SecondsToWait == 0, ErrMsg);
    return Result.ReturnCode;
  }

  if (ExecutionFailed)
    *ExecutionFailed = true;

  return -1;
}